

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSelect.c
# Opt level: O1

int If_ManNodeShapeMap(If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Int_t *vShape)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  void **ppvVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  If_Man_t *pIVar8;
  
  if (*(uint *)&(pIfObj->CutBest).field_0x1c < 0x2000000) {
    __assert_fail("pCut->nLeaves > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifSelect.c"
                  ,0x87,"int If_ManNodeShapeMap(If_Man_t *, If_Obj_t *, Vec_Int_t *)");
  }
  if (0xffffff < *(uint *)&(pIfObj->CutBest).field_0x1c) {
    pVVar1 = pIfMan->vObjs;
    uVar5 = 0;
    do {
      iVar4 = *(int *)(&pIfObj[1].field_0x0 + uVar5 * 4);
      if (((long)iVar4 < 0) || (pVVar1->nSize <= iVar4)) goto LAB_003a0586;
      pvVar2 = pVVar1->pArray[iVar4];
      if (pvVar2 == (void *)0x0) break;
      if (*(int *)((long)pvVar2 + 0x50) != 0) {
        __assert_fail("If_CutDataInt( If_ObjCutBest(pLeaf) ) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifSelect.c"
                      ,0x8b,"int If_ManNodeShapeMap(If_Man_t *, If_Obj_t *, Vec_Int_t *)");
      }
      *(undefined4 *)((long)pvVar2 + 0x50) = 1;
      uVar5 = uVar5 + 1;
    } while (uVar5 < (byte)(pIfObj->CutBest).field_0x1f);
  }
  iVar7 = 0;
  vShape->nSize = 0;
  pVVar1 = pIfMan->vTemp;
  pVVar1->nSize = 0;
  pIVar8 = pIfMan;
  iVar4 = If_ManNodeShapeMap_rec(pIfMan,pIfObj,pVVar1,vShape);
  if (iVar4 == -1) {
    Abc_Print((int)pIVar8,"If_ManNodeShapeMap(): Computing local AIG has failed.\n");
  }
  else {
    if (0xffffff < *(uint *)&(pIfObj->CutBest).field_0x1c) {
      pVVar1 = pIfMan->vObjs;
      uVar5 = 0;
      do {
        iVar4 = *(int *)(&pIfObj[1].field_0x0 + uVar5 * 4);
        if (((long)iVar4 < 0) || (pVVar1->nSize <= iVar4)) {
LAB_003a0586:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar2 = pVVar1->pArray[iVar4];
        if (pvVar2 == (void *)0x0) break;
        *(undefined4 *)((long)pvVar2 + 0x50) = 0;
        uVar5 = uVar5 + 1;
      } while (uVar5 < (byte)(pIfObj->CutBest).field_0x1f);
    }
    pVVar1 = pIfMan->vTemp;
    iVar7 = 1;
    if (0 < pVVar1->nSize) {
      ppvVar3 = pVVar1->pArray;
      lVar6 = 0;
      do {
        *(undefined4 *)ppvVar3[lVar6] = 0;
        lVar6 = lVar6 + 1;
      } while (lVar6 < pVVar1->nSize);
    }
  }
  return iVar7;
}

Assistant:

int If_ManNodeShapeMap( If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Int_t * vShape )
{
    If_Cut_t * pCut;
    If_Obj_t * pLeaf;
    int i, iRes;
    // get the best cut
    pCut = If_ObjCutBest(pIfObj);
    assert( pCut->nLeaves > 1 );
    // set the leaf variables
    If_CutForEachLeaf( pIfMan, pCut, pLeaf, i )
    {
        assert( If_CutDataInt( If_ObjCutBest(pLeaf) ) == 0 );
        If_CutSetDataInt( If_ObjCutBest(pLeaf), 1 );
    }
    // recursively compute the function while collecting visited cuts
    Vec_IntClear( vShape );
    Vec_PtrClear( pIfMan->vTemp );
    iRes = If_ManNodeShapeMap_rec( pIfMan, pIfObj, pIfMan->vTemp, vShape ); 
    if ( iRes == ~0 )
    {
        Abc_Print( -1, "If_ManNodeShapeMap(): Computing local AIG has failed.\n" );
        return 0;
    }
    // clean the cuts
    If_CutForEachLeaf( pIfMan, pCut, pLeaf, i )
        If_CutSetDataInt( If_ObjCutBest(pLeaf), 0 );
    Vec_PtrForEachEntry( If_Cut_t *, pIfMan->vTemp, pCut, i )
        If_CutSetDataInt( pCut, 0 );
    return 1;
}